

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O3

void fld_scale(limb_t *res,limb_t *e,limb_t s)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  lVar3 = SUB168(SEXT816(s) * SEXT816(*e),8);
  uVar4 = lVar3 << 0xd | (ulong)(s * *e) >> 0x33;
  uVar6 = s * *e & 0x7ffffffffffff;
  *res = uVar6;
  uVar1 = s * e[1];
  uVar2 = uVar1 + uVar4;
  lVar3 = SUB168(SEXT816(s) * SEXT816(e[1]),8) + (lVar3 >> 0x33) + (ulong)CARRY8(uVar1,uVar4);
  uVar4 = lVar3 * 0x2000 | uVar2 >> 0x33;
  res[1] = uVar2 & 0x7ffffffffffff;
  uVar1 = s * e[2];
  uVar2 = uVar1 + uVar4;
  lVar3 = SUB168(SEXT816(s) * SEXT816(e[2]),8) + (lVar3 >> 0x33) + (ulong)CARRY8(uVar1,uVar4);
  uVar4 = lVar3 * 0x2000 | uVar2 >> 0x33;
  res[2] = uVar2 & 0x7ffffffffffff;
  uVar1 = s * e[3];
  uVar2 = uVar1 + uVar4;
  lVar5 = SUB168(SEXT816(s) * SEXT816(e[3]),8) + (lVar3 >> 0x33) + (ulong)CARRY8(uVar1,uVar4);
  uVar4 = lVar5 * 0x2000 | uVar2 >> 0x33;
  res[3] = uVar2 & 0x7ffffffffffff;
  lVar3 = e[4];
  uVar1 = s * e[4];
  uVar2 = uVar1 + uVar4;
  res[4] = uVar2 & 0x7ffffffffffff;
  *res = ((SUB168(SEXT816(s) * SEXT816(lVar3),8) + (lVar5 >> 0x33) + (ulong)CARRY8(uVar1,uVar4)) *
          0x2000 | uVar2 >> 0x33) * 0x13 + uVar6;
  return;
}

Assistant:

void
fld_scale(fld_t res, const fld_t e, limb_t s)
{
	llimb_t carry;

	carry = (llimb_t)s*e[0];
	res[0] = carry & FLD_LIMB_MASK;

	carry = (carry >> FLD_LIMB_BITS) + (llimb_t)s*e[1];
	res[1] = carry & FLD_LIMB_MASK;

	carry = (carry >> FLD_LIMB_BITS) + (llimb_t)s*e[2];
	res[2] = carry & FLD_LIMB_MASK;

	carry = (carry >> FLD_LIMB_BITS) + (llimb_t)s*e[3];
	res[3] = carry & FLD_LIMB_MASK;

	carry = (carry >> FLD_LIMB_BITS) + (llimb_t)s*e[4];
	res[4] = carry & FLD_LIMB_MASK;

	res[0] += 19*(carry >> FLD_LIMB_BITS);
}